

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall ON_Line::IsFartherThan(ON_Line *this,double d,ON_Line *L)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  ON_3dPoint local_140;
  ON_3dPoint local_128;
  ON_3dPoint local_110;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_3dVector local_b0;
  ON_3dVector local_98;
  bool local_7a;
  bool local_79;
  bool bCheckB;
  double dStack_78;
  bool bCheckA;
  double x;
  double t;
  double b;
  double a;
  ON_3dPoint B;
  ON_3dPoint A;
  ON_Line *L_local;
  double d_local;
  ON_Line *this_local;
  
  b = (this->from).x;
  if (b <= (this->to).x) {
    t = (this->to).x;
  }
  else {
    t = b;
    b = (this->to).x;
  }
  if (((L->from).x <= t + d) || ((L->to).x <= t + d)) {
    if ((b - d < (L->from).x || b - d == (L->from).x) || (b - d < (L->to).x || b - d == (L->to).x))
    {
      b = (this->from).y;
      if (b <= (this->to).y) {
        t = (this->to).y;
      }
      else {
        t = b;
        b = (this->to).y;
      }
      if (((L->from).y <= t + d) || ((L->to).y <= t + d)) {
        pdVar1 = &(L->from).y;
        if ((b - d < *pdVar1 || b - d == *pdVar1) ||
           (pdVar1 = &(L->to).y, b - d < *pdVar1 || b - d == *pdVar1)) {
          b = (this->from).z;
          if (b <= (this->to).z) {
            t = (this->to).z;
          }
          else {
            t = b;
            b = (this->to).z;
          }
          if (((L->from).z <= t + d) || ((L->to).z <= t + d)) {
            pdVar1 = &(L->from).z;
            if ((b - d < *pdVar1 || b - d == *pdVar1) ||
               (pdVar1 = &(L->to).z, b - d < *pdVar1 || b - d == *pdVar1)) {
              bVar2 = ON_Intersect(this,L,&b,&t);
              if (!bVar2) {
                Direction(&local_98,this);
                Direction(&local_b0,L);
                dVar3 = ON_3dVector::operator*(&local_98,&local_b0);
                if (dVar3 < 0.0) {
                  b = 1.0;
                  ClosestPointTo(L,&this->to,&t);
                  if (t < 0.0) {
                    t = 0.0;
                    ClosestPointTo(this,&L->from,&b);
                  }
                }
                else {
                  b = 0.0;
                  ClosestPointTo(L,&this->from,&t);
                  if (t < 0.0) {
                    t = 0.0;
                    ClosestPointTo(this,&L->from,&b);
                  }
                }
              }
              PointAt(&local_c8,this,b);
              B.z = local_c8.x;
              PointAt(&local_e0,L,t);
              a = local_e0.x;
              B.x = local_e0.y;
              B.y = local_e0.z;
              dStack_78 = ON_3dPoint::DistanceTo((ON_3dPoint *)&B.z,(ON_3dPoint *)&a);
              if (dStack_78 <= d) {
                local_79 = true;
                if (0.0 <= b) {
                  local_79 = 1.0 < b;
                  if (local_79) {
                    b = 1.0;
                  }
                }
                else {
                  b = 0.0;
                }
                if (local_79 != false) {
                  PointAt(&local_f8,this,b);
                  B.z = local_f8.x;
                  ClosestPointTo(L,(ON_3dPoint *)&B.z,&x);
                  if (0.0 <= x) {
                    if (1.0 < x) {
                      x = 1.0;
                    }
                  }
                  else {
                    x = 0.0;
                  }
                  PointAt(&local_110,L,x);
                  dStack_78 = ON_3dPoint::DistanceTo(&local_110,(ON_3dPoint *)&B.z);
                }
                local_7a = true;
                if (0.0 <= t) {
                  local_7a = 1.0 < t;
                  if (local_7a) {
                    t = 1.0;
                  }
                }
                else {
                  t = 0.0;
                }
                dVar3 = dStack_78;
                if (local_7a != false) {
                  PointAt(&local_128,L,t);
                  a = local_128.x;
                  B.x = local_128.y;
                  B.y = local_128.z;
                  ClosestPointTo(this,(ON_3dPoint *)&a,&x);
                  if (0.0 <= x) {
                    if (1.0 < x) {
                      x = 1.0;
                    }
                  }
                  else {
                    x = 0.0;
                  }
                  PointAt(&local_140,this,x);
                  dVar4 = ON_3dPoint::DistanceTo(&local_140,(ON_3dPoint *)&a);
                  dVar3 = dVar4;
                  if (((local_79 & 1U) != 0) && (dVar3 = dStack_78, dVar4 < dStack_78)) {
                    dVar3 = dVar4;
                  }
                }
                dStack_78 = dVar3;
                this_local._7_1_ = d < dStack_78;
              }
              else {
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Line::IsFartherThan( double d, const ON_Line& L ) const
{
  ON_3dPoint A, B;
  double a, b, t, x;
  bool bCheckA, bCheckB;

  a = from.x; if (to.x < a) {b=a; a = to.x;} else b = to.x;
  if ( b+d < L.from.x && b+d < L.to.x )
    return true;
  if ( a-d > L.from.x && a-d > L.to.x )
    return true;

  a = from.y; if (to.y < a) {b=a; a = to.y;} else b = to.y;
  if ( b+d < L.from.y && b+d < L.to.y )
    return true;
  if ( a-d > L.from.y && a-d > L.to.y )
    return true;

  a = from.z; if (to.z < a) {b=a; a = to.z;} else b = to.z;
  if ( b+d < L.from.z && b+d < L.to.z )
    return true;
  if ( a-d > L.from.z && a-d > L.to.z )
    return true;

  if ( !ON_Intersect(*this,L,&a,&b) )
  {
    // lines are parallel or anti parallel
    if ( Direction()*L.Direction() >= 0.0 )
    {
      // lines are parallel
      a = 0.0;
      L.ClosestPointTo(from,&b);
      // If ( b >= 0.0), then this->from and L(b) are a pair of closest points.
      if ( b < 0.0 )
      {
        // Otherwise L.from and this(a) are a pair of closest points.
        b = 0.0;
        ClosestPointTo(L.from,&a);
      }
    }
    else
    {
      // lines are anti parallel
      a = 1.0;
      L.ClosestPointTo(to,&b);
      // If ( b >= 0.0), then this->to and L(b) are a pair of closest points.
      if ( b < 0.0 )
      {
        // Otherwise L.to and this(a) are a pair of closest points.
        b = 0.0;
        ClosestPointTo(L.from,&a);
      }
    }
  }

  A = PointAt(a);
  B = L.PointAt(b);
  x = A.DistanceTo(B);
  if (x > d)
    return true;

  bCheckA = true;
  if ( a < 0.0) a = 0.0; else if (a > 1.0) a = 1.0; else bCheckA=false;
  if (bCheckA )
  {
    A = PointAt(a);
    L.ClosestPointTo(A,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    x = L.PointAt(t).DistanceTo(A);
  }

  bCheckB = true;
  if ( b < 0.0) b = 0.0; else if (b > 1.0) b = 1.0; else bCheckB=false;
  if ( bCheckB )
  {
    B = L.PointAt(b);
    ClosestPointTo(B,&t);
    if (t<0.0) t = 0.0; else if (t > 1.0) t = 1.0;
    t = PointAt(t).DistanceTo(B);
    if ( bCheckA )
    {
      if ( t<x ) x = t;
    }
    else
    {
      x = t;
    }
  }
 
  return (x > d);
}